

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Code parse(TokenList *list)

{
  int iVar1;
  void *__dest;
  Code CVar2;
  Statement local_68;
  Compiler *local_28;
  Compiler *comp;
  TokenList *list_local;
  Code c;
  
  comp = (Compiler *)list;
  memset(&list_local,0,0x10);
  head = (TokenList *)comp;
  local_28 = initCompiler((Compiler *)0x0,0,BLOCK_NONE);
  while( true ) {
    iVar1 = match(TOKEN_EOF);
    if (iVar1 != 0) break;
    list_local._0_4_ = (uint)list_local + 1;
    c._0_8_ = realloc((void *)c._0_8_,(long)(int)(uint)list_local << 6);
    __dest = (void *)(c._0_8_ + (long)(int)((uint)list_local - 1) * 0x40);
    part(&local_68,local_28);
    memcpy(__dest,&local_68,0x40);
  }
  free(local_28);
  CVar2._4_4_ = 0;
  CVar2.count = (uint)list_local;
  CVar2.parts = (Statement *)c._0_8_;
  return CVar2;
}

Assistant:

Code parse(TokenList *list){
    Code c = {0, NULL};
    head = list;
    Compiler *comp = initCompiler(NULL, 0, BLOCK_NONE);
    while(!match(TOKEN_EOF)){
        c.count++;
        c.parts = (Statement *)reallocate(c.parts, sizeof(Statement) * c.count);
        c.parts[c.count - 1] = part(comp);
    }
    memfree(comp);
    return c;
}